

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O1

int count_bits(int offset,int len)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 1;
  if (2 < len) {
    iVar2 = 1;
    uVar3 = len - 1;
    do {
      iVar2 = iVar2 + 2;
      bVar1 = 3 < uVar3;
      uVar3 = uVar3 >> 1;
    } while (bVar1);
  }
  return iVar2 + (uint)(0x80 < offset) * 4 + 9;
}

Assistant:

int count_bits(int offset, int len) {
    return 1 + (offset > 128 ? 12 : 8) + elias_gamma_bits(len-1);
}